

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

void __thiscall BackwardPass::TraceDeadStoreOfInstrsForScopeObjectRemoval(BackwardPass *this)

{
  Instr *pIVar1;
  bool bVar2;
  uint uVar3;
  JITTimeFunctionBody *this_00;
  char16 *pcVar4;
  Instr *instr;
  BackwardPass *this_local;
  
  pIVar1 = this->currentInstr;
  bVar2 = Func::IsStackArgsEnabled(pIVar1->m_func);
  if (((bVar2) &&
      (((pIVar1->m_opcode == InitCachedScope || (pIVar1->m_opcode == NewScopeObject)) &&
       (bVar2 = IsPrePass(this), !bVar2)))) &&
     (bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,StackArgFormalsOptPhase), bVar2)) {
    this_00 = Func::GetJITFunctionBody(pIVar1->m_func);
    pcVar4 = JITTimeFunctionBody::GetDisplayName(this_00);
    uVar3 = Func::GetFunctionNumber(pIVar1->m_func);
    Output::Print(L"StackArgFormals : %s (%d) :Removing Scope object creation in Deadstore pass. \n"
                  ,pcVar4,(ulong)uVar3);
    Output::Flush();
  }
  return;
}

Assistant:

void
BackwardPass::TraceDeadStoreOfInstrsForScopeObjectRemoval()
{
    IR::Instr * instr = this->currentInstr;

    if (instr->m_func->IsStackArgsEnabled())
    {
        if ((instr->m_opcode == Js::OpCode::InitCachedScope || instr->m_opcode == Js::OpCode::NewScopeObject) && !IsPrePass())
        {
            if (PHASE_TRACE1(Js::StackArgFormalsOptPhase))
            {
                Output::Print(_u("StackArgFormals : %s (%d) :Removing Scope object creation in Deadstore pass. \n"), instr->m_func->GetJITFunctionBody()->GetDisplayName(), instr->m_func->GetFunctionNumber());
                Output::Flush();
            }
        }
    }
}